

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

void Nwk_ObjAddFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_1c;
  int i;
  Nwk_Obj_t *pFanin_local;
  Nwk_Obj_t *pObj_local;
  
  if (pObj->pMan != pFanin->pMan) {
    __assert_fail("pObj->pMan == pFanin->pMan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xa8,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if ((-1 < pObj->Id) && (-1 < pFanin->Id)) {
    iVar2 = Nwk_ObjReallocIsNeeded(pObj);
    if (iVar2 != 0) {
      Nwk_ManReallocNode(pObj);
    }
    iVar2 = Nwk_ObjReallocIsNeeded(pFanin);
    if (iVar2 != 0) {
      Nwk_ManReallocNode(pFanin);
    }
    for (local_1c = pObj->nFanins + pObj->nFanouts; pObj->nFanins < local_1c;
        local_1c = local_1c + -1) {
      pObj->pFanio[local_1c] = pObj->pFanio[local_1c + -1];
    }
    iVar2 = pObj->nFanins;
    pObj->nFanins = iVar2 + 1;
    pObj->pFanio[iVar2] = pFanin;
    iVar2 = pFanin->nFanouts;
    pFanin->nFanouts = iVar2 + 1;
    pFanin->pFanio[pFanin->nFanins + iVar2] = pObj;
    iVar2 = pObj->Level;
    iVar1 = pFanin->Level;
    iVar3 = Nwk_ObjIsNode(pObj);
    iVar2 = Abc_MaxInt(iVar2,iVar1 + iVar3);
    pObj->Level = iVar2;
    return;
  }
  __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                ,0xa9,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjAddFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i;
    assert( pObj->pMan == pFanin->pMan );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( Nwk_ObjReallocIsNeeded(pObj) )
        Nwk_ManReallocNode( pObj );
    if ( Nwk_ObjReallocIsNeeded(pFanin) )
        Nwk_ManReallocNode( pFanin );
    for ( i = pObj->nFanins + pObj->nFanouts; i > pObj->nFanins; i-- )
        pObj->pFanio[i] = pObj->pFanio[i-1];
    pObj->pFanio[pObj->nFanins++] = pFanin;
    pFanin->pFanio[pFanin->nFanins + pFanin->nFanouts++] = pObj;
    pObj->Level = Abc_MaxInt( pObj->Level, pFanin->Level + Nwk_ObjIsNode(pObj) );
}